

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# spxsolve.hpp
# Opt level: O0

bool __thiscall
soplex::
SPxSolverBase<boost::multiprecision::number<boost::multiprecision::backends::cpp_dec_float<100U,_int,_void>,_(boost::multiprecision::expression_template_option)0>_>
::performSolutionPolishing
          (SPxSolverBase<boost::multiprecision::number<boost::multiprecision::backends::cpp_dec_float<100U,_int,_void>,_(boost::multiprecision::expression_template_option)0>_>
           *this)

{
  SPxRatioTester<boost::multiprecision::number<boost::multiprecision::backends::cpp_dec_float<100U,_int,_void>,_(boost::multiprecision::expression_template_option)0>_>
  *pSVar1;
  Status *pSVar2;
  bool bVar3;
  bool bVar4;
  int iVar5;
  Status SVar6;
  Verbosity VVar7;
  Representation RVar8;
  Type TVar9;
  int iVar10;
  int iVar11;
  number<boost::multiprecision::backends::cpp_dec_float<100U,_int,_void>,_(boost::multiprecision::expression_template_option)0>
  *pnVar12;
  int *piVar13;
  char *pcVar14;
  DataKey *pDVar15;
  SPxId *pSVar16;
  int __c;
  int __c_00;
  int __c_01;
  int __c_02;
  int __c_03;
  undefined8 extraout_RDX;
  undefined8 extraout_RDX_00;
  undefined8 extraout_RDX_01;
  undefined8 uVar17;
  undefined8 extraout_RDX_02;
  undefined8 extraout_RDX_03;
  undefined8 extraout_RDX_04;
  undefined8 extraout_RDX_05;
  undefined8 extraout_RDX_06;
  undefined8 extraout_RDX_07;
  undefined8 extraout_RDX_08;
  SPxSolverBase<boost::multiprecision::number<boost::multiprecision::backends::cpp_dec_float<100U,_int,_void>,_(boost::multiprecision::expression_template_option)0>_>
  *in_RDI;
  Verbosity old_verbosity_1;
  int i_9;
  int i_8;
  DIdxSet basiccandidates_1;
  int i_7;
  int i_6;
  DIdxSet basiccandidates;
  int ncols_1;
  bool useIntegrality;
  int i_5;
  int i_4;
  DIdxSet candidates;
  int i_3;
  int i_2;
  int i_1;
  int i;
  DIdxSet continuousvars;
  DIdxSet slackcandidates;
  int ncols;
  int nrows;
  Verbosity old_verbosity;
  number<boost::multiprecision::backends::cpp_dec_float<100U,_int,_void>,_(boost::multiprecision::expression_template_option)0>
  origval;
  number<boost::multiprecision::backends::cpp_dec_float<100U,_int,_void>,_(boost::multiprecision::expression_template_option)0>
  alloweddeviation;
  bool success;
  SPxId polishId;
  Status stat;
  Status *colstatus;
  Status *rowstatus;
  Desc *ds;
  int nSuccessfulPivots;
  bool stop;
  undefined1 in_stack_00000a63;
  int in_stack_00000a64;
  SPxSolverBase<boost::multiprecision::number<boost::multiprecision::backends::cpp_dec_float<100U,_int,_void>,_(boost::multiprecision::expression_template_option)0>_>
  *in_stack_00000a68;
  scoped_default_precision<boost::multiprecision::number<boost::multiprecision::backends::cpp_dec_float<100U,_int,_void>,_(boost::multiprecision::expression_template_option)0>,_false>
  precision_guard_1;
  number<boost::multiprecision::backends::cpp_dec_float<100U,_int,_void>,_(boost::multiprecision::expression_template_option)0>
  *result_1;
  scoped_default_precision<boost::multiprecision::number<boost::multiprecision::backends::cpp_dec_float<100U,_int,_void>,_(boost::multiprecision::expression_template_option)0>,_false>
  precision_guard;
  number<boost::multiprecision::backends::cpp_dec_float<100U,_int,_void>,_(boost::multiprecision::expression_template_option)0>
  *result;
  undefined4 in_stack_fffffffffffff4d8;
  int in_stack_fffffffffffff4dc;
  undefined6 in_stack_fffffffffffff4e0;
  undefined1 in_stack_fffffffffffff4e6;
  undefined1 in_stack_fffffffffffff4e7;
  SPxSolverBase<boost::multiprecision::number<boost::multiprecision::backends::cpp_dec_float<100U,_int,_void>,_(boost::multiprecision::expression_template_option)0>_>
  *in_stack_fffffffffffff4e8;
  SPxStatus stat_00;
  undefined4 in_stack_fffffffffffff4f0;
  undefined2 in_stack_fffffffffffff4f4;
  byte in_stack_fffffffffffff4f6;
  undefined1 in_stack_fffffffffffff4f7;
  undefined4 in_stack_fffffffffffff4f8;
  int in_stack_fffffffffffff4fc;
  DIdxSet *in_stack_fffffffffffff500;
  DataArray<int> *this_00;
  byte local_ade;
  int in_stack_fffffffffffff554;
  undefined4 in_stack_fffffffffffff558;
  undefined4 in_stack_fffffffffffff55c;
  byte local_a7a;
  byte local_a65;
  byte local_a43;
  byte local_a2b;
  byte local_9fd;
  undefined1 local_9fc [28];
  number<boost::multiprecision::backends::cpp_dec_float<100U,_int,_void>,_(boost::multiprecision::expression_template_option)0>
  *in_stack_fffffffffffff620;
  number<boost::multiprecision::backends::cpp_dec_float<100U,_int,_void>,_(boost::multiprecision::expression_template_option)0>
  *in_stack_fffffffffffff628;
  number<boost::multiprecision::backends::cpp_dec_float<100U,_int,_void>,_(boost::multiprecision::expression_template_option)0>
  *in_stack_fffffffffffff630;
  undefined1 local_9ac [80];
  undefined1 local_95c [80];
  undefined4 local_90c;
  Verbosity local_908;
  uint local_904;
  undefined4 local_8b0;
  undefined1 local_8ac [80];
  undefined1 local_85c [80];
  SPxColId local_80c;
  int local_804;
  IdxSet local_800;
  uint local_7dc;
  undefined4 local_788;
  undefined1 local_784 [80];
  undefined1 local_734 [80];
  SPxColId local_6e4;
  int local_6dc;
  IdxSet local_6d8;
  int local_6b4;
  byte local_6ad;
  undefined1 local_6ac [80];
  DataKey local_65c;
  uint local_654;
  undefined4 local_600;
  undefined1 local_5fc [80];
  undefined1 local_5ac [80];
  int local_55c;
  IdxSet local_558;
  DataKey local_534;
  uint local_52c;
  DataKey local_528;
  uint local_520;
  undefined4 local_4cc;
  undefined1 local_4c8 [80];
  undefined1 local_478 [80];
  int local_428;
  undefined4 local_3d4;
  undefined1 local_3d0 [80];
  undefined1 local_380 [80];
  int local_330;
  IdxSet local_320;
  IdxSet local_300;
  int local_2dc;
  int local_2d8;
  undefined1 local_2d4 [80];
  undefined4 local_284;
  Verbosity local_280;
  undefined1 local_27c [80];
  undefined1 local_22c [83];
  byte local_1d9;
  DataKey local_1d8;
  Status local_1cc;
  Status *local_1c8;
  Status *local_1c0;
  Desc *local_1b8;
  int local_1b0;
  byte local_1a9;
  bool local_199;
  undefined8 local_198;
  undefined4 *local_190;
  undefined1 *local_188;
  undefined8 local_180;
  undefined4 *local_178;
  undefined1 *local_170;
  undefined8 local_168;
  undefined4 *local_160;
  undefined1 *local_158;
  undefined8 local_150;
  undefined4 *local_148;
  undefined1 *local_140;
  undefined8 local_138;
  undefined4 *local_130;
  undefined1 *local_128;
  undefined1 *local_120;
  number<boost::multiprecision::backends::cpp_dec_float<100U,_int,_void>,_(boost::multiprecision::expression_template_option)0>
  *local_118;
  undefined1 *local_110;
  number<boost::multiprecision::backends::cpp_dec_float<100U,_int,_void>,_(boost::multiprecision::expression_template_option)0>
  *local_108;
  undefined1 *local_100;
  number<boost::multiprecision::backends::cpp_dec_float<100U,_int,_void>,_(boost::multiprecision::expression_template_option)0>
  *local_f8;
  undefined1 *local_f0;
  undefined1 *local_e8;
  undefined1 *local_e0;
  undefined1 *local_d8;
  undefined1 *local_d0;
  undefined1 *local_c8;
  undefined1 *local_c0;
  undefined1 *local_b8;
  undefined1 *local_b0;
  undefined4 *local_a8;
  undefined4 *local_a0;
  undefined4 *local_98;
  undefined4 *local_90;
  undefined4 *local_88;
  scoped_default_precision<boost::multiprecision::number<boost::multiprecision::backends::cpp_dec_float<100u,int,void>,(boost::multiprecision::expression_template_option)0>,false>
  local_79;
  number<boost::multiprecision::backends::cpp_dec_float<100U,_int,_void>,_(boost::multiprecision::expression_template_option)0>
  *local_78;
  number<boost::multiprecision::backends::cpp_dec_float<100U,_int,_void>,_(boost::multiprecision::expression_template_option)0>
  *local_70;
  undefined1 *local_68;
  undefined1 *local_60;
  number<boost::multiprecision::backends::cpp_dec_float<100U,_int,_void>,_(boost::multiprecision::expression_template_option)0>
  *local_58;
  number<boost::multiprecision::backends::cpp_dec_float<100U,_int,_void>,_(boost::multiprecision::expression_template_option)0>
  *local_50;
  undefined1 *local_48;
  scoped_default_precision<boost::multiprecision::number<boost::multiprecision::backends::cpp_dec_float<100u,int,void>,(boost::multiprecision::expression_template_option)0>,false>
  local_39;
  number<boost::multiprecision::backends::cpp_dec_float<100U,_int,_void>,_(boost::multiprecision::expression_template_option)0>
  *local_38;
  number<boost::multiprecision::backends::cpp_dec_float<100U,_int,_void>,_(boost::multiprecision::expression_template_option)0>
  *local_30;
  undefined1 *local_28;
  undefined1 *local_20;
  number<boost::multiprecision::backends::cpp_dec_float<100U,_int,_void>,_(boost::multiprecision::expression_template_option)0>
  *local_18;
  number<boost::multiprecision::backends::cpp_dec_float<100U,_int,_void>,_(boost::multiprecision::expression_template_option)0>
  *local_10;
  undefined1 *local_8;
  
  local_9fd = 0;
  if (-1 < in_RDI->maxIters) {
    iVar5 = iterations((SPxSolverBase<boost::multiprecision::number<boost::multiprecision::backends::cpp_dec_float<100U,_int,_void>,_(boost::multiprecision::expression_template_option)0>_>
                        *)0x51285e);
    local_9fd = 0;
    if (in_RDI->maxIters <= iVar5) {
      bVar3 = isTimeLimitReached((SPxSolverBase<boost::multiprecision::number<boost::multiprecision::backends::cpp_dec_float<100U,_int,_void>,_(boost::multiprecision::expression_template_option)0>_>
                                  *)CONCAT44(in_stack_fffffffffffff55c,in_stack_fffffffffffff558),
                                 SUB41((uint)in_stack_fffffffffffff554 >> 0x18,0));
      local_9fd = bVar3 ^ 0xff;
    }
  }
  local_1a9 = local_9fd & 1;
  if (((local_1a9 == 0) && (in_RDI->polishObj != POLISH_OFF)) &&
     (SVar6 = status(in_stack_fffffffffffff4e8), SVar6 == OPTIMAL)) {
    local_1b8 = SPxBasisBase<boost::multiprecision::number<boost::multiprecision::backends::cpp_dec_float<100U,_int,_void>,_(boost::multiprecision::expression_template_option)0>_>
                ::desc(&in_RDI->
                        super_SPxBasisBase<boost::multiprecision::number<boost::multiprecision::backends::cpp_dec_float<100U,_int,_void>,_(boost::multiprecision::expression_template_option)0>_>
                      );
    local_1c0 = SPxBasisBase<boost::multiprecision::number<boost::multiprecision::backends::cpp_dec_float<100U,_int,_void>,_(boost::multiprecision::expression_template_option)0>_>
                ::Desc::rowStatus((Desc *)0x512904);
    local_1c8 = SPxBasisBase<boost::multiprecision::number<boost::multiprecision::backends::cpp_dec_float<100U,_int,_void>,_(boost::multiprecision::expression_template_option)0>_>
                ::Desc::colStatus((Desc *)0x512919);
    SPxId::SPxId((SPxId *)0x51292e);
    local_1d9 = 0;
    local_120 = local_22c;
    boost::multiprecision::backends::cpp_dec_float<100U,_int,_void>::cpp_dec_float
              ((cpp_dec_float<100U,_int,_void> *)
               CONCAT17(in_stack_fffffffffffff4e7,
                        CONCAT16(in_stack_fffffffffffff4e6,in_stack_fffffffffffff4e0)));
    (*(in_RDI->
      super_SPxLPBase<boost::multiprecision::number<boost::multiprecision::backends::cpp_dec_float<100U,_int,_void>,_(boost::multiprecision::expression_template_option)0>_>
      ).
      super_LPRowSetBase<boost::multiprecision::number<boost::multiprecision::backends::cpp_dec_float<100U,_int,_void>,_(boost::multiprecision::expression_template_option)0>_>
      .
      super_SVSetBase<boost::multiprecision::number<boost::multiprecision::backends::cpp_dec_float<100U,_int,_void>,_(boost::multiprecision::expression_template_option)0>_>
      .
      super_ClassArray<soplex::Nonzero<boost::multiprecision::number<boost::multiprecision::backends::cpp_dec_float<100U,_int,_void>,_(boost::multiprecision::expression_template_option)0>_>_>
      ._vptr_ClassArray[0x5e])(local_27c);
    if ((in_RDI->spxout != (SPxOut *)0x0) &&
       (VVar7 = SPxOut::getVerbosity(in_RDI->spxout), 3 < (int)VVar7)) {
      local_280 = SPxOut::getVerbosity(in_RDI->spxout);
      local_284 = 4;
      (*in_RDI->spxout->_vptr_SPxOut[2])(in_RDI->spxout,&local_284);
      soplex::operator<<((SPxOut *)
                         CONCAT17(in_stack_fffffffffffff4e7,
                                  CONCAT16(in_stack_fffffffffffff4e6,in_stack_fffffffffffff4e0)),
                         (char *)CONCAT44(in_stack_fffffffffffff4dc,in_stack_fffffffffffff4d8));
      soplex::operator<<((SPxOut *)
                         CONCAT17(in_stack_fffffffffffff4e7,
                                  CONCAT16(in_stack_fffffffffffff4e6,in_stack_fffffffffffff4e0)),
                         (_func_ostream_ptr_ostream_ptr *)
                         CONCAT44(in_stack_fffffffffffff4dc,in_stack_fffffffffffff4d8));
      (*in_RDI->spxout->_vptr_SPxOut[2])(in_RDI->spxout,&local_280);
    }
    RVar8 = rep(in_RDI);
    TVar9 = (Type)((ulong)in_stack_fffffffffffff4e8 >> 0x20);
    if (RVar8 == COLUMN) {
      setType((SPxSolverBase<boost::multiprecision::number<boost::multiprecision::backends::cpp_dec_float<100U,_int,_void>,_(boost::multiprecision::expression_template_option)0>_>
               *)CONCAT17(in_stack_fffffffffffff4f7,
                          CONCAT16(in_stack_fffffffffffff4f6,
                                   CONCAT24(in_stack_fffffffffffff4f4,in_stack_fffffffffffff4f0))),
              TVar9);
      (*(in_RDI->
        super_SPxLPBase<boost::multiprecision::number<boost::multiprecision::backends::cpp_dec_float<100U,_int,_void>,_(boost::multiprecision::expression_template_option)0>_>
        ).
        super_LPRowSetBase<boost::multiprecision::number<boost::multiprecision::backends::cpp_dec_float<100U,_int,_void>,_(boost::multiprecision::expression_template_option)0>_>
        .
        super_SVSetBase<boost::multiprecision::number<boost::multiprecision::backends::cpp_dec_float<100U,_int,_void>,_(boost::multiprecision::expression_template_option)0>_>
        .
        super_ClassArray<soplex::Nonzero<boost::multiprecision::number<boost::multiprecision::backends::cpp_dec_float<100U,_int,_void>,_(boost::multiprecision::expression_template_option)0>_>_>
        ._vptr_ClassArray[0x76])();
      entertol((SPxSolverBase<boost::multiprecision::number<boost::multiprecision::backends::cpp_dec_float<100U,_int,_void>,_(boost::multiprecision::expression_template_option)0>_>
                *)CONCAT44(in_stack_fffffffffffff4fc,in_stack_fffffffffffff4f8));
      local_b0 = local_22c;
      local_b8 = local_2d4;
      boost::multiprecision::backends::cpp_dec_float<100U,_int,_void>::operator=
                ((cpp_dec_float<100U,_int,_void> *)
                 CONCAT17(in_stack_fffffffffffff4e7,
                          CONCAT16(in_stack_fffffffffffff4e6,in_stack_fffffffffffff4e0)),
                 (cpp_dec_float<100U,_int,_void> *)
                 CONCAT44(in_stack_fffffffffffff4dc,in_stack_fffffffffffff4d8));
      in_RDI->instableEnter = false;
      pSVar1 = in_RDI->theratiotester;
      TVar9 = type(in_RDI);
      (*pSVar1->_vptr_SPxRatioTester[9])(pSVar1,(ulong)(uint)TVar9);
      local_2d8 = SPxLPBase<boost::multiprecision::number<boost::multiprecision::backends::cpp_dec_float<100U,_int,_void>,_(boost::multiprecision::expression_template_option)0>_>
                  ::nRows((SPxLPBase<boost::multiprecision::number<boost::multiprecision::backends::cpp_dec_float<100U,_int,_void>,_(boost::multiprecision::expression_template_option)0>_>
                           *)0x512af6);
      local_2dc = SPxLPBase<boost::multiprecision::number<boost::multiprecision::backends::cpp_dec_float<100U,_int,_void>,_(boost::multiprecision::expression_template_option)0>_>
                  ::nCols((SPxLPBase<boost::multiprecision::number<boost::multiprecision::backends::cpp_dec_float<100U,_int,_void>,_(boost::multiprecision::expression_template_option)0>_>
                           *)0x512b0a);
      if (in_RDI->polishObj == POLISH_INTEGRALITY) {
        DIdxSet::DIdxSet(in_stack_fffffffffffff500,in_stack_fffffffffffff4fc);
        DIdxSet::DIdxSet(in_stack_fffffffffffff500,in_stack_fffffffffffff4fc);
        for (local_330 = 0; local_330 < local_2d8; local_330 = local_330 + 1) {
          if ((local_1c0[local_330] == P_ON_LOWER) || (local_1c0[local_330] == P_ON_UPPER)) {
            local_118 = VectorBase<boost::multiprecision::number<boost::multiprecision::backends::cpp_dec_float<100U,_int,_void>,_(boost::multiprecision::expression_template_option)0>_>
                        ::operator[]((VectorBase<boost::multiprecision::number<boost::multiprecision::backends::cpp_dec_float<100U,_int,_void>,_(boost::multiprecision::expression_template_option)0>_>
                                      *)CONCAT17(in_stack_fffffffffffff4e7,
                                                 CONCAT16(in_stack_fffffffffffff4e6,
                                                          in_stack_fffffffffffff4e0)),
                                     in_stack_fffffffffffff4dc);
            local_110 = local_380;
            boost::multiprecision::backends::cpp_dec_float<100U,_int,_void>::cpp_dec_float
                      ((cpp_dec_float<100U,_int,_void> *)
                       CONCAT17(in_stack_fffffffffffff4e7,
                                CONCAT16(in_stack_fffffffffffff4e6,in_stack_fffffffffffff4e0)),
                       (cpp_dec_float<100U,_int,_void> *)
                       CONCAT44(in_stack_fffffffffffff4dc,in_stack_fffffffffffff4d8));
            local_3d4 = 0;
            local_188 = local_3d0;
            local_190 = &local_3d4;
            local_198 = 0;
            local_88 = local_190;
            boost::multiprecision::backends::cpp_dec_float<100U,_int,_void>::
            cpp_dec_float<long_long>
                      ((cpp_dec_float<100U,_int,_void> *)
                       CONCAT17(in_stack_fffffffffffff4f7,
                                CONCAT16(in_stack_fffffffffffff4f6,
                                         CONCAT24(in_stack_fffffffffffff4f4,
                                                  in_stack_fffffffffffff4f0))),
                       (longlong)in_stack_fffffffffffff4e8,
                       (type *)CONCAT17(in_stack_fffffffffffff4e7,
                                        CONCAT16(in_stack_fffffffffffff4e6,in_stack_fffffffffffff4e0
                                                )));
            epsilon(in_stack_fffffffffffff4e8);
            bVar3 = EQrel<boost::multiprecision::number<boost::multiprecision::backends::cpp_dec_float<100u,int,void>,(boost::multiprecision::expression_template_option)0>,boost::multiprecision::number<boost::multiprecision::backends::cpp_dec_float<100u,int,void>,(boost::multiprecision::expression_template_option)0>,boost::multiprecision::number<boost::multiprecision::backends::cpp_dec_float<100u,int,void>,(boost::multiprecision::expression_template_option)0>>
                              (in_stack_fffffffffffff630,in_stack_fffffffffffff628,
                               in_stack_fffffffffffff620);
            if (bVar3) {
              DIdxSet::addIdx((DIdxSet *)
                              CONCAT17(in_stack_fffffffffffff4e7,
                                       CONCAT16(in_stack_fffffffffffff4e6,in_stack_fffffffffffff4e0)
                                      ),in_stack_fffffffffffff4dc);
            }
          }
        }
        iVar5 = DataArray<int>::size(&in_RDI->integerVariables);
        if (iVar5 == local_2dc) {
          for (local_428 = 0; local_428 < local_2dc; local_428 = local_428 + 1) {
            if ((local_1c8[local_428] == P_ON_LOWER) || (local_1c8[local_428] == P_ON_UPPER)) {
              pnVar12 = SPxLPBase<boost::multiprecision::number<boost::multiprecision::backends::cpp_dec_float<100U,_int,_void>,_(boost::multiprecision::expression_template_option)0>_>
                        ::maxObj((SPxLPBase<boost::multiprecision::number<boost::multiprecision::backends::cpp_dec_float<100U,_int,_void>,_(boost::multiprecision::expression_template_option)0>_>
                                  *)CONCAT17(in_stack_fffffffffffff4e7,
                                             CONCAT16(in_stack_fffffffffffff4e6,
                                                      in_stack_fffffffffffff4e0)),
                                 in_stack_fffffffffffff4dc);
              local_38 = VectorBase<boost::multiprecision::number<boost::multiprecision::backends::cpp_dec_float<100U,_int,_void>,_(boost::multiprecision::expression_template_option)0>_>
                         ::operator[]((VectorBase<boost::multiprecision::number<boost::multiprecision::backends::cpp_dec_float<100U,_int,_void>,_(boost::multiprecision::expression_template_option)0>_>
                                       *)CONCAT17(in_stack_fffffffffffff4e7,
                                                  CONCAT16(in_stack_fffffffffffff4e6,
                                                           in_stack_fffffffffffff4e0)),
                                      in_stack_fffffffffffff4dc);
              local_30 = pnVar12;
              local_28 = local_478;
              boost::multiprecision::detail::
              scoped_default_precision<boost::multiprecision::number<boost::multiprecision::backends::cpp_dec_float<100u,int,void>,(boost::multiprecision::expression_template_option)0>,false>
              ::
              scoped_default_precision<boost::multiprecision::number<boost::multiprecision::backends::cpp_dec_float<100u,int,void>,(boost::multiprecision::expression_template_option)0>,boost::multiprecision::number<boost::multiprecision::backends::cpp_dec_float<100u,int,void>,(boost::multiprecision::expression_template_option)0>>
                        (&local_39,pnVar12,local_38);
              local_20 = local_478;
              boost::multiprecision::backends::cpp_dec_float<100U,_int,_void>::cpp_dec_float
                        ((cpp_dec_float<100U,_int,_void> *)
                         CONCAT17(in_stack_fffffffffffff4e7,
                                  CONCAT16(in_stack_fffffffffffff4e6,in_stack_fffffffffffff4e0)));
              local_10 = local_30;
              local_18 = local_38;
              local_8 = local_478;
              boost::multiprecision::default_ops::
              eval_subtract<boost::multiprecision::backends::cpp_dec_float<100u,int,void>,boost::multiprecision::backends::cpp_dec_float<100u,int,void>,boost::multiprecision::backends::cpp_dec_float<100u,int,void>>
                        ((cpp_dec_float<100U,_int,_void> *)
                         CONCAT17(in_stack_fffffffffffff4e7,
                                  CONCAT16(in_stack_fffffffffffff4e6,in_stack_fffffffffffff4e0)),
                         (cpp_dec_float<100U,_int,_void> *)
                         CONCAT44(in_stack_fffffffffffff4dc,in_stack_fffffffffffff4d8),
                         (cpp_dec_float<100U,_int,_void> *)0x512e6c);
              local_4cc = 0;
              local_170 = local_4c8;
              local_178 = &local_4cc;
              local_180 = 0;
              local_90 = local_178;
              boost::multiprecision::backends::cpp_dec_float<100U,_int,_void>::
              cpp_dec_float<long_long>
                        ((cpp_dec_float<100U,_int,_void> *)
                         CONCAT17(in_stack_fffffffffffff4f7,
                                  CONCAT16(in_stack_fffffffffffff4f6,
                                           CONCAT24(in_stack_fffffffffffff4f4,
                                                    in_stack_fffffffffffff4f0))),
                         (longlong)in_stack_fffffffffffff4e8,
                         (type *)CONCAT17(in_stack_fffffffffffff4e7,
                                          CONCAT16(in_stack_fffffffffffff4e6,
                                                   in_stack_fffffffffffff4e0)));
              epsilon(in_stack_fffffffffffff4e8);
              bVar4 = EQrel<boost::multiprecision::number<boost::multiprecision::backends::cpp_dec_float<100u,int,void>,(boost::multiprecision::expression_template_option)0>,boost::multiprecision::number<boost::multiprecision::backends::cpp_dec_float<100u,int,void>,(boost::multiprecision::expression_template_option)0>,boost::multiprecision::number<boost::multiprecision::backends::cpp_dec_float<100u,int,void>,(boost::multiprecision::expression_template_option)0>>
                                (in_stack_fffffffffffff630,in_stack_fffffffffffff628,
                                 in_stack_fffffffffffff620);
              bVar3 = false;
              if (bVar4) {
                piVar13 = DataArray<int>::operator[](&in_RDI->integerVariables,local_428);
                bVar3 = *piVar13 == 0;
              }
              if (bVar3) {
                DIdxSet::addIdx((DIdxSet *)
                                CONCAT17(in_stack_fffffffffffff4e7,
                                         CONCAT16(in_stack_fffffffffffff4e6,
                                                  in_stack_fffffffffffff4e0)),
                                in_stack_fffffffffffff4dc);
              }
            }
          }
        }
        while (stat_00 = (SPxStatus)((ulong)in_stack_fffffffffffff4e8 >> 0x20),
              ((local_1a9 ^ 0xff) & 1) != 0) {
          local_1b0 = 0;
          local_520 = IdxSet::size(&local_300);
          uVar17 = extraout_RDX;
          while( true ) {
            local_520 = local_520 - 1;
            local_a2b = 0;
            if (-1 < (int)local_520) {
              local_a2b = local_1a9 ^ 0xff;
            }
            if ((local_a2b & 1) == 0) break;
            IdxSet::index(&local_300,(char *)(ulong)local_520,(int)uVar17);
            local_528 = (DataKey)coId((SPxSolverBase<boost::multiprecision::number<boost::multiprecision::backends::cpp_dec_float<100U,_int,_void>,_(boost::multiprecision::expression_template_option)0>_>
                                       *)CONCAT44(in_stack_fffffffffffff4fc,
                                                  in_stack_fffffffffffff4f8),
                                      CONCAT13(in_stack_fffffffffffff4f7,
                                               CONCAT12(in_stack_fffffffffffff4f6,
                                                        in_stack_fffffffffffff4f4)));
            pSVar2 = local_1c0;
            local_1d8 = local_528;
            pcVar14 = IdxSet::index(&local_300,(char *)(ulong)local_520,__c);
            SPxOut::
            debug<soplex::SPxSolverBase<boost::multiprecision::number<boost::multiprecision::backends::cpp_dec_float<100U,_int,_void>,_(boost::multiprecision::expression_template_option)0>_>,_const_char_(&)[27],_soplex::SPxId_&,_const_soplex::SPxBasisBase<boost::multiprecision::number<boost::multiprecision::backends::cpp_dec_float<100U,_int,_void>,_(boost::multiprecision::expression_template_option)0>_>::Desc::Status_&,_0>
                      (in_RDI,(char (*) [27])"try pivoting: {} stat: {}\n",(SPxId *)&local_1d8,
                       pSVar2 + (int)pcVar14);
            local_1d9 = enter((SPxSolverBase<boost::multiprecision::number<boost::multiprecision::backends::cpp_dec_float<100U,_int,_void>,_(boost::multiprecision::expression_template_option)0>_>
                               *)origval.m_backend.data._M_elems._12_8_,
                              (SPxId *)origval.m_backend.data._M_elems._4_8_,
                              origval.m_backend.data._M_elems[0]._3_1_);
            (*(in_RDI->
              super_SPxLPBase<boost::multiprecision::number<boost::multiprecision::backends::cpp_dec_float<100U,_int,_void>,_(boost::multiprecision::expression_template_option)0>_>
              ).
              super_LPRowSetBase<boost::multiprecision::number<boost::multiprecision::backends::cpp_dec_float<100U,_int,_void>,_(boost::multiprecision::expression_template_option)0>_>
              .
              super_SVSetBase<boost::multiprecision::number<boost::multiprecision::backends::cpp_dec_float<100U,_int,_void>,_(boost::multiprecision::expression_template_option)0>_>
              .
              super_ClassArray<soplex::Nonzero<boost::multiprecision::number<boost::multiprecision::backends::cpp_dec_float<100U,_int,_void>,_(boost::multiprecision::expression_template_option)0>_>_>
              ._vptr_ClassArray[0x88])();
            if ((local_1d9 & 1) != 0) {
              SPxOut::
              debug<soplex::SPxSolverBase<boost::multiprecision::number<boost::multiprecision::backends::cpp_dec_float<100U,_int,_void>,_(boost::multiprecision::expression_template_option)0>_>,_const_char_(&)[13],_0>
                        (in_RDI,(char (*) [13])" -> success!");
              local_1b0 = local_1b0 + 1;
              IdxSet::remove(&local_300,(char *)(ulong)local_520);
              if ((-1 < in_RDI->maxIters) &&
                 (iVar5 = iterations((SPxSolverBase<boost::multiprecision::number<boost::multiprecision::backends::cpp_dec_float<100U,_int,_void>,_(boost::multiprecision::expression_template_option)0>_>
                                      *)0x513149), in_RDI->maxIters <= iVar5)) {
                local_1a9 = 1;
              }
            }
            SPxOut::
            debug<soplex::SPxSolverBase<boost::multiprecision::number<boost::multiprecision::backends::cpp_dec_float<100U,_int,_void>,_(boost::multiprecision::expression_template_option)0>_>,_const_char_(&)[2],_0>
                      (in_RDI,(char (*) [2])0x7e7535);
            bVar3 = isTimeLimitReached((SPxSolverBase<boost::multiprecision::number<boost::multiprecision::backends::cpp_dec_float<100U,_int,_void>,_(boost::multiprecision::expression_template_option)0>_>
                                        *)CONCAT44(in_stack_fffffffffffff55c,
                                                   in_stack_fffffffffffff558),
                                       SUB41((uint)in_stack_fffffffffffff554 >> 0x18,0));
            uVar17 = extraout_RDX_00;
            if (bVar3) {
              local_1a9 = 1;
            }
          }
          local_52c = IdxSet::size(&local_320);
          uVar17 = extraout_RDX_01;
          while( true ) {
            local_52c = local_52c - 1;
            local_a43 = 0;
            if (-1 < (int)local_52c) {
              local_a43 = local_1a9 ^ 0xff;
            }
            if ((local_a43 & 1) == 0) break;
            IdxSet::index(&local_320,(char *)(ulong)local_52c,(int)uVar17);
            local_534 = (DataKey)id((SPxSolverBase<boost::multiprecision::number<boost::multiprecision::backends::cpp_dec_float<100U,_int,_void>,_(boost::multiprecision::expression_template_option)0>_>
                                     *)CONCAT44(in_stack_fffffffffffff4fc,in_stack_fffffffffffff4f8)
                                    ,CONCAT13(in_stack_fffffffffffff4f7,
                                              CONCAT12(in_stack_fffffffffffff4f6,
                                                       in_stack_fffffffffffff4f4)));
            pSVar2 = local_1c8;
            local_1d8 = local_534;
            pcVar14 = IdxSet::index(&local_320,(char *)(ulong)local_52c,__c_00);
            SPxOut::
            debug<soplex::SPxSolverBase<boost::multiprecision::number<boost::multiprecision::backends::cpp_dec_float<100U,_int,_void>,_(boost::multiprecision::expression_template_option)0>_>,_const_char_(&)[27],_soplex::SPxId_&,_const_soplex::SPxBasisBase<boost::multiprecision::number<boost::multiprecision::backends::cpp_dec_float<100U,_int,_void>,_(boost::multiprecision::expression_template_option)0>_>::Desc::Status_&,_0>
                      (in_RDI,(char (*) [27])"try pivoting: {} stat: {}\n",(SPxId *)&local_1d8,
                       pSVar2 + (int)pcVar14);
            local_1d9 = enter((SPxSolverBase<boost::multiprecision::number<boost::multiprecision::backends::cpp_dec_float<100U,_int,_void>,_(boost::multiprecision::expression_template_option)0>_>
                               *)origval.m_backend.data._M_elems._12_8_,
                              (SPxId *)origval.m_backend.data._M_elems._4_8_,
                              origval.m_backend.data._M_elems[0]._3_1_);
            (*(in_RDI->
              super_SPxLPBase<boost::multiprecision::number<boost::multiprecision::backends::cpp_dec_float<100U,_int,_void>,_(boost::multiprecision::expression_template_option)0>_>
              ).
              super_LPRowSetBase<boost::multiprecision::number<boost::multiprecision::backends::cpp_dec_float<100U,_int,_void>,_(boost::multiprecision::expression_template_option)0>_>
              .
              super_SVSetBase<boost::multiprecision::number<boost::multiprecision::backends::cpp_dec_float<100U,_int,_void>,_(boost::multiprecision::expression_template_option)0>_>
              .
              super_ClassArray<soplex::Nonzero<boost::multiprecision::number<boost::multiprecision::backends::cpp_dec_float<100U,_int,_void>,_(boost::multiprecision::expression_template_option)0>_>_>
              ._vptr_ClassArray[0x88])();
            if ((local_1d9 & 1) != 0) {
              SPxOut::
              debug<soplex::SPxSolverBase<boost::multiprecision::number<boost::multiprecision::backends::cpp_dec_float<100U,_int,_void>,_(boost::multiprecision::expression_template_option)0>_>,_const_char_(&)[13],_0>
                        (in_RDI,(char (*) [13])" -> success!");
              local_1b0 = local_1b0 + 1;
              IdxSet::remove(&local_320,(char *)(ulong)local_52c);
              if ((-1 < in_RDI->maxIters) &&
                 (iVar5 = iterations((SPxSolverBase<boost::multiprecision::number<boost::multiprecision::backends::cpp_dec_float<100U,_int,_void>,_(boost::multiprecision::expression_template_option)0>_>
                                      *)0x513354), in_RDI->maxIters <= iVar5)) {
                local_1a9 = 1;
              }
            }
            SPxOut::
            debug<soplex::SPxSolverBase<boost::multiprecision::number<boost::multiprecision::backends::cpp_dec_float<100U,_int,_void>,_(boost::multiprecision::expression_template_option)0>_>,_const_char_(&)[2],_0>
                      (in_RDI,(char (*) [2])0x7e7535);
            bVar3 = isTimeLimitReached((SPxSolverBase<boost::multiprecision::number<boost::multiprecision::backends::cpp_dec_float<100U,_int,_void>,_(boost::multiprecision::expression_template_option)0>_>
                                        *)CONCAT44(in_stack_fffffffffffff55c,
                                                   in_stack_fffffffffffff558),
                                       SUB41((uint)in_stack_fffffffffffff554 >> 0x18,0));
            uVar17 = extraout_RDX_02;
            if (bVar3) {
              local_1a9 = 1;
            }
          }
          if (local_1b0 == 0) {
            local_1a9 = 1;
          }
          in_RDI->polishCount = local_1b0 + in_RDI->polishCount;
        }
        DIdxSet::~DIdxSet((DIdxSet *)
                          CONCAT17(in_stack_fffffffffffff4e7,
                                   CONCAT16(in_stack_fffffffffffff4e6,in_stack_fffffffffffff4e0)));
        DIdxSet::~DIdxSet((DIdxSet *)
                          CONCAT17(in_stack_fffffffffffff4e7,
                                   CONCAT16(in_stack_fffffffffffff4e6,in_stack_fffffffffffff4e0)));
      }
      else {
        dim((SPxSolverBase<boost::multiprecision::number<boost::multiprecision::backends::cpp_dec_float<100U,_int,_void>,_(boost::multiprecision::expression_template_option)0>_>
             *)0x513439);
        DIdxSet::DIdxSet(in_stack_fffffffffffff500,in_stack_fffffffffffff4fc);
        local_55c = 0;
        while( true ) {
          iVar5 = local_55c;
          iVar10 = SPxLPBase<boost::multiprecision::number<boost::multiprecision::backends::cpp_dec_float<100U,_int,_void>,_(boost::multiprecision::expression_template_option)0>_>
                   ::nCols((SPxLPBase<boost::multiprecision::number<boost::multiprecision::backends::cpp_dec_float<100U,_int,_void>,_(boost::multiprecision::expression_template_option)0>_>
                            *)0x51346e);
          local_a65 = 0;
          if (iVar5 < iVar10) {
            local_a65 = local_1a9 ^ 0xff;
          }
          if ((local_a65 & 1) == 0) break;
          if ((local_1c8[local_55c] == P_ON_LOWER) || (local_1c8[local_55c] == P_ON_UPPER)) {
            pnVar12 = SPxLPBase<boost::multiprecision::number<boost::multiprecision::backends::cpp_dec_float<100U,_int,_void>,_(boost::multiprecision::expression_template_option)0>_>
                      ::maxObj((SPxLPBase<boost::multiprecision::number<boost::multiprecision::backends::cpp_dec_float<100U,_int,_void>,_(boost::multiprecision::expression_template_option)0>_>
                                *)CONCAT17(in_stack_fffffffffffff4e7,
                                           CONCAT16(in_stack_fffffffffffff4e6,
                                                    in_stack_fffffffffffff4e0)),
                               in_stack_fffffffffffff4dc);
            local_78 = VectorBase<boost::multiprecision::number<boost::multiprecision::backends::cpp_dec_float<100U,_int,_void>,_(boost::multiprecision::expression_template_option)0>_>
                       ::operator[]((VectorBase<boost::multiprecision::number<boost::multiprecision::backends::cpp_dec_float<100U,_int,_void>,_(boost::multiprecision::expression_template_option)0>_>
                                     *)CONCAT17(in_stack_fffffffffffff4e7,
                                                CONCAT16(in_stack_fffffffffffff4e6,
                                                         in_stack_fffffffffffff4e0)),
                                    in_stack_fffffffffffff4dc);
            local_70 = pnVar12;
            local_68 = local_5ac;
            boost::multiprecision::detail::
            scoped_default_precision<boost::multiprecision::number<boost::multiprecision::backends::cpp_dec_float<100u,int,void>,(boost::multiprecision::expression_template_option)0>,false>
            ::
            scoped_default_precision<boost::multiprecision::number<boost::multiprecision::backends::cpp_dec_float<100u,int,void>,(boost::multiprecision::expression_template_option)0>,boost::multiprecision::number<boost::multiprecision::backends::cpp_dec_float<100u,int,void>,(boost::multiprecision::expression_template_option)0>>
                      (&local_79,pnVar12,local_78);
            local_60 = local_5ac;
            boost::multiprecision::backends::cpp_dec_float<100U,_int,_void>::cpp_dec_float
                      ((cpp_dec_float<100U,_int,_void> *)
                       CONCAT17(in_stack_fffffffffffff4e7,
                                CONCAT16(in_stack_fffffffffffff4e6,in_stack_fffffffffffff4e0)));
            local_50 = local_70;
            local_58 = local_78;
            local_48 = local_5ac;
            boost::multiprecision::default_ops::
            eval_subtract<boost::multiprecision::backends::cpp_dec_float<100u,int,void>,boost::multiprecision::backends::cpp_dec_float<100u,int,void>,boost::multiprecision::backends::cpp_dec_float<100u,int,void>>
                      ((cpp_dec_float<100U,_int,_void> *)
                       CONCAT17(in_stack_fffffffffffff4e7,
                                CONCAT16(in_stack_fffffffffffff4e6,in_stack_fffffffffffff4e0)),
                       (cpp_dec_float<100U,_int,_void> *)
                       CONCAT44(in_stack_fffffffffffff4dc,in_stack_fffffffffffff4d8),
                       (cpp_dec_float<100U,_int,_void> *)0x5135d3);
            local_600 = 0;
            local_158 = local_5fc;
            local_160 = &local_600;
            local_168 = 0;
            local_98 = local_160;
            boost::multiprecision::backends::cpp_dec_float<100U,_int,_void>::
            cpp_dec_float<long_long>
                      ((cpp_dec_float<100U,_int,_void> *)
                       CONCAT17(in_stack_fffffffffffff4f7,
                                CONCAT16(in_stack_fffffffffffff4f6,
                                         CONCAT24(in_stack_fffffffffffff4f4,
                                                  in_stack_fffffffffffff4f0))),
                       (longlong)in_stack_fffffffffffff4e8,
                       (type *)CONCAT17(in_stack_fffffffffffff4e7,
                                        CONCAT16(in_stack_fffffffffffff4e6,in_stack_fffffffffffff4e0
                                                )));
            epsilon(in_stack_fffffffffffff4e8);
            bVar3 = EQrel<boost::multiprecision::number<boost::multiprecision::backends::cpp_dec_float<100u,int,void>,(boost::multiprecision::expression_template_option)0>,boost::multiprecision::number<boost::multiprecision::backends::cpp_dec_float<100u,int,void>,(boost::multiprecision::expression_template_option)0>,boost::multiprecision::number<boost::multiprecision::backends::cpp_dec_float<100u,int,void>,(boost::multiprecision::expression_template_option)0>>
                              (in_stack_fffffffffffff630,in_stack_fffffffffffff628,
                               in_stack_fffffffffffff620);
            if (bVar3) {
              DIdxSet::addIdx((DIdxSet *)
                              CONCAT17(in_stack_fffffffffffff4e7,
                                       CONCAT16(in_stack_fffffffffffff4e6,in_stack_fffffffffffff4e0)
                                      ),in_stack_fffffffffffff4dc);
            }
          }
          local_55c = local_55c + 1;
        }
        while (stat_00 = (SPxStatus)((ulong)in_stack_fffffffffffff4e8 >> 0x20),
              ((local_1a9 ^ 0xff) & 1) != 0) {
          local_1b0 = 0;
          local_654 = IdxSet::size(&local_558);
          uVar17 = extraout_RDX_03;
          while( true ) {
            local_654 = local_654 - 1;
            local_a7a = 0;
            if (-1 < (int)local_654) {
              local_a7a = local_1a9 ^ 0xff;
            }
            if ((local_a7a & 1) == 0) break;
            IdxSet::index(&local_558,(char *)(ulong)local_654,(int)uVar17);
            local_65c = (DataKey)id((SPxSolverBase<boost::multiprecision::number<boost::multiprecision::backends::cpp_dec_float<100U,_int,_void>,_(boost::multiprecision::expression_template_option)0>_>
                                     *)CONCAT44(in_stack_fffffffffffff4fc,in_stack_fffffffffffff4f8)
                                    ,CONCAT13(in_stack_fffffffffffff4f7,
                                              CONCAT12(in_stack_fffffffffffff4f6,
                                                       in_stack_fffffffffffff4f4)));
            pSVar2 = local_1c8;
            local_1d8 = local_65c;
            pcVar14 = IdxSet::index(&local_558,(char *)(ulong)local_654,__c_01);
            SPxOut::
            debug<soplex::SPxSolverBase<boost::multiprecision::number<boost::multiprecision::backends::cpp_dec_float<100U,_int,_void>,_(boost::multiprecision::expression_template_option)0>_>,_const_char_(&)[27],_soplex::SPxId_&,_const_soplex::SPxBasisBase<boost::multiprecision::number<boost::multiprecision::backends::cpp_dec_float<100U,_int,_void>,_(boost::multiprecision::expression_template_option)0>_>::Desc::Status_&,_0>
                      (in_RDI,(char (*) [27])"try pivoting: {} stat: {}\n",(SPxId *)&local_1d8,
                       pSVar2 + (int)pcVar14);
            local_1d9 = enter((SPxSolverBase<boost::multiprecision::number<boost::multiprecision::backends::cpp_dec_float<100U,_int,_void>,_(boost::multiprecision::expression_template_option)0>_>
                               *)origval.m_backend.data._M_elems._12_8_,
                              (SPxId *)origval.m_backend.data._M_elems._4_8_,
                              origval.m_backend.data._M_elems[0]._3_1_);
            (*(in_RDI->
              super_SPxLPBase<boost::multiprecision::number<boost::multiprecision::backends::cpp_dec_float<100U,_int,_void>,_(boost::multiprecision::expression_template_option)0>_>
              ).
              super_LPRowSetBase<boost::multiprecision::number<boost::multiprecision::backends::cpp_dec_float<100U,_int,_void>,_(boost::multiprecision::expression_template_option)0>_>
              .
              super_SVSetBase<boost::multiprecision::number<boost::multiprecision::backends::cpp_dec_float<100U,_int,_void>,_(boost::multiprecision::expression_template_option)0>_>
              .
              super_ClassArray<soplex::Nonzero<boost::multiprecision::number<boost::multiprecision::backends::cpp_dec_float<100U,_int,_void>,_(boost::multiprecision::expression_template_option)0>_>_>
              ._vptr_ClassArray[0x88])();
            if ((local_1d9 & 1) != 0) {
              SPxOut::
              debug<soplex::SPxSolverBase<boost::multiprecision::number<boost::multiprecision::backends::cpp_dec_float<100U,_int,_void>,_(boost::multiprecision::expression_template_option)0>_>,_const_char_(&)[13],_0>
                        (in_RDI,(char (*) [13])" -> success!");
              local_1b0 = local_1b0 + 1;
              IdxSet::remove(&local_558,(char *)(ulong)local_654);
              if ((-1 < in_RDI->maxIters) &&
                 (iVar5 = iterations((SPxSolverBase<boost::multiprecision::number<boost::multiprecision::backends::cpp_dec_float<100U,_int,_void>,_(boost::multiprecision::expression_template_option)0>_>
                                      *)0x513895), in_RDI->maxIters <= iVar5)) {
                local_1a9 = 1;
              }
            }
            SPxOut::
            debug<soplex::SPxSolverBase<boost::multiprecision::number<boost::multiprecision::backends::cpp_dec_float<100U,_int,_void>,_(boost::multiprecision::expression_template_option)0>_>,_const_char_(&)[2],_0>
                      (in_RDI,(char (*) [2])0x7e7535);
            bVar3 = isTimeLimitReached((SPxSolverBase<boost::multiprecision::number<boost::multiprecision::backends::cpp_dec_float<100U,_int,_void>,_(boost::multiprecision::expression_template_option)0>_>
                                        *)CONCAT44(in_stack_fffffffffffff55c,
                                                   in_stack_fffffffffffff558),
                                       SUB41((uint)in_stack_fffffffffffff554 >> 0x18,0));
            uVar17 = extraout_RDX_04;
            if (bVar3) {
              local_1a9 = 1;
            }
          }
          if (local_1b0 == 0) {
            local_1a9 = 1;
          }
          in_RDI->polishCount = local_1b0 + in_RDI->polishCount;
        }
        DIdxSet::~DIdxSet((DIdxSet *)
                          CONCAT17(in_stack_fffffffffffff4e7,
                                   CONCAT16(in_stack_fffffffffffff4e6,in_stack_fffffffffffff4e0)));
      }
    }
    else {
      setType((SPxSolverBase<boost::multiprecision::number<boost::multiprecision::backends::cpp_dec_float<100U,_int,_void>,_(boost::multiprecision::expression_template_option)0>_>
               *)CONCAT17(in_stack_fffffffffffff4f7,
                          CONCAT16(in_stack_fffffffffffff4f6,
                                   CONCAT24(in_stack_fffffffffffff4f4,in_stack_fffffffffffff4f0))),
              TVar9);
      (*(in_RDI->
        super_SPxLPBase<boost::multiprecision::number<boost::multiprecision::backends::cpp_dec_float<100U,_int,_void>,_(boost::multiprecision::expression_template_option)0>_>
        ).
        super_LPRowSetBase<boost::multiprecision::number<boost::multiprecision::backends::cpp_dec_float<100U,_int,_void>,_(boost::multiprecision::expression_template_option)0>_>
        .
        super_SVSetBase<boost::multiprecision::number<boost::multiprecision::backends::cpp_dec_float<100U,_int,_void>,_(boost::multiprecision::expression_template_option)0>_>
        .
        super_ClassArray<soplex::Nonzero<boost::multiprecision::number<boost::multiprecision::backends::cpp_dec_float<100U,_int,_void>,_(boost::multiprecision::expression_template_option)0>_>_>
        ._vptr_ClassArray[0x76])();
      leavetol((SPxSolverBase<boost::multiprecision::number<boost::multiprecision::backends::cpp_dec_float<100U,_int,_void>,_(boost::multiprecision::expression_template_option)0>_>
                *)CONCAT44(in_stack_fffffffffffff4fc,in_stack_fffffffffffff4f8));
      local_c0 = local_22c;
      local_c8 = local_6ac;
      boost::multiprecision::backends::cpp_dec_float<100U,_int,_void>::operator=
                ((cpp_dec_float<100U,_int,_void> *)
                 CONCAT17(in_stack_fffffffffffff4e7,
                          CONCAT16(in_stack_fffffffffffff4e6,in_stack_fffffffffffff4e0)),
                 (cpp_dec_float<100U,_int,_void> *)
                 CONCAT44(in_stack_fffffffffffff4dc,in_stack_fffffffffffff4d8));
      in_RDI->instableLeave = false;
      pSVar1 = in_RDI->theratiotester;
      TVar9 = type(in_RDI);
      (*pSVar1->_vptr_SPxRatioTester[9])(pSVar1,(ulong)(uint)TVar9);
      local_6ad = 0;
      local_6b4 = SPxLPBase<boost::multiprecision::number<boost::multiprecision::backends::cpp_dec_float<100U,_int,_void>,_(boost::multiprecision::expression_template_option)0>_>
                  ::nCols((SPxLPBase<boost::multiprecision::number<boost::multiprecision::backends::cpp_dec_float<100U,_int,_void>,_(boost::multiprecision::expression_template_option)0>_>
                           *)0x513a03);
      iVar5 = DataArray<int>::size(&in_RDI->integerVariables);
      if (iVar5 == local_6b4) {
        local_6ad = 1;
      }
      if (in_RDI->polishObj == POLISH_INTEGRALITY) {
        dim((SPxSolverBase<boost::multiprecision::number<boost::multiprecision::backends::cpp_dec_float<100U,_int,_void>,_(boost::multiprecision::expression_template_option)0>_>
             *)0x513a51);
        DIdxSet::DIdxSet(in_stack_fffffffffffff500,in_stack_fffffffffffff4fc);
        local_6dc = 0;
        while (iVar5 = local_6dc,
              iVar10 = dim((SPxSolverBase<boost::multiprecision::number<boost::multiprecision::backends::cpp_dec_float<100U,_int,_void>,_(boost::multiprecision::expression_template_option)0>_>
                            *)0x513a86), iVar5 < iVar10) {
          pDVar15 = &SPxBasisBase<boost::multiprecision::number<boost::multiprecision::backends::cpp_dec_float<100U,_int,_void>,_(boost::multiprecision::expression_template_option)0>_>
                     ::baseId((SPxBasisBase<boost::multiprecision::number<boost::multiprecision::backends::cpp_dec_float<100U,_int,_void>,_(boost::multiprecision::expression_template_option)0>_>
                               *)CONCAT17(in_stack_fffffffffffff4e7,
                                          CONCAT16(in_stack_fffffffffffff4e6,
                                                   in_stack_fffffffffffff4e0)),
                              in_stack_fffffffffffff4dc)->super_DataKey;
          local_1d8 = *pDVar15;
          bVar3 = SPxId::isSPxRowId((SPxId *)&local_1d8);
          if (bVar3) {
            in_stack_fffffffffffff554 =
                 SPxLPBase<boost::multiprecision::number<boost::multiprecision::backends::cpp_dec_float<100U,_int,_void>,_(boost::multiprecision::expression_template_option)0>_>
                 ::number((SPxLPBase<boost::multiprecision::number<boost::multiprecision::backends::cpp_dec_float<100U,_int,_void>,_(boost::multiprecision::expression_template_option)0>_>
                           *)CONCAT17(in_stack_fffffffffffff4f7,
                                      CONCAT16(in_stack_fffffffffffff4f6,
                                               CONCAT24(in_stack_fffffffffffff4f4,
                                                        in_stack_fffffffffffff4f0))),
                          (SPxId *)in_stack_fffffffffffff4e8);
            local_1cc = SPxBasisBase<boost::multiprecision::number<boost::multiprecision::backends::cpp_dec_float<100U,_int,_void>,_(boost::multiprecision::expression_template_option)0>_>
                        ::Desc::rowStatus((Desc *)CONCAT17(in_stack_fffffffffffff4e7,
                                                           CONCAT16(in_stack_fffffffffffff4e6,
                                                                    in_stack_fffffffffffff4e0)),
                                          in_stack_fffffffffffff4dc);
LAB_00513c09:
            if ((local_1cc == P_ON_LOWER) || (local_1cc == P_ON_UPPER)) {
              local_108 = VectorBase<boost::multiprecision::number<boost::multiprecision::backends::cpp_dec_float<100U,_int,_void>,_(boost::multiprecision::expression_template_option)0>_>
                          ::operator[]((VectorBase<boost::multiprecision::number<boost::multiprecision::backends::cpp_dec_float<100U,_int,_void>,_(boost::multiprecision::expression_template_option)0>_>
                                        *)CONCAT17(in_stack_fffffffffffff4e7,
                                                   CONCAT16(in_stack_fffffffffffff4e6,
                                                            in_stack_fffffffffffff4e0)),
                                       in_stack_fffffffffffff4dc);
              local_100 = local_734;
              boost::multiprecision::backends::cpp_dec_float<100U,_int,_void>::cpp_dec_float
                        ((cpp_dec_float<100U,_int,_void> *)
                         CONCAT17(in_stack_fffffffffffff4e7,
                                  CONCAT16(in_stack_fffffffffffff4e6,in_stack_fffffffffffff4e0)),
                         (cpp_dec_float<100U,_int,_void> *)
                         CONCAT44(in_stack_fffffffffffff4dc,in_stack_fffffffffffff4d8));
              local_788 = 0;
              local_140 = local_784;
              local_148 = &local_788;
              local_150 = 0;
              local_a0 = local_148;
              boost::multiprecision::backends::cpp_dec_float<100U,_int,_void>::
              cpp_dec_float<long_long>
                        ((cpp_dec_float<100U,_int,_void> *)
                         CONCAT17(in_stack_fffffffffffff4f7,
                                  CONCAT16(in_stack_fffffffffffff4f6,
                                           CONCAT24(in_stack_fffffffffffff4f4,
                                                    in_stack_fffffffffffff4f0))),
                         (longlong)in_stack_fffffffffffff4e8,
                         (type *)CONCAT17(in_stack_fffffffffffff4e7,
                                          CONCAT16(in_stack_fffffffffffff4e6,
                                                   in_stack_fffffffffffff4e0)));
              epsilon(in_stack_fffffffffffff4e8);
              bVar3 = EQrel<boost::multiprecision::number<boost::multiprecision::backends::cpp_dec_float<100u,int,void>,(boost::multiprecision::expression_template_option)0>,boost::multiprecision::number<boost::multiprecision::backends::cpp_dec_float<100u,int,void>,(boost::multiprecision::expression_template_option)0>,boost::multiprecision::number<boost::multiprecision::backends::cpp_dec_float<100u,int,void>,(boost::multiprecision::expression_template_option)0>>
                                (in_stack_fffffffffffff630,in_stack_fffffffffffff628,
                                 in_stack_fffffffffffff620);
              if (bVar3) {
                DIdxSet::addIdx((DIdxSet *)
                                CONCAT17(in_stack_fffffffffffff4e7,
                                         CONCAT16(in_stack_fffffffffffff4e6,
                                                  in_stack_fffffffffffff4e0)),
                                in_stack_fffffffffffff4dc);
              }
            }
          }
          else {
            bVar3 = true;
            if ((local_6ad & 1) != 0) {
              SPxColId::SPxColId(&local_6e4,(SPxId *)&local_1d8);
              iVar5 = SPxLPBase<boost::multiprecision::number<boost::multiprecision::backends::cpp_dec_float<100U,_int,_void>,_(boost::multiprecision::expression_template_option)0>_>
                      ::number((SPxLPBase<boost::multiprecision::number<boost::multiprecision::backends::cpp_dec_float<100U,_int,_void>,_(boost::multiprecision::expression_template_option)0>_>
                                *)CONCAT17(in_stack_fffffffffffff4e7,
                                           CONCAT16(in_stack_fffffffffffff4e6,
                                                    in_stack_fffffffffffff4e0)),
                               (SPxColId *)
                               CONCAT44(in_stack_fffffffffffff4dc,in_stack_fffffffffffff4d8));
              piVar13 = DataArray<int>::operator[](&in_RDI->integerVariables,iVar5);
              bVar3 = *piVar13 == 1;
            }
            if (!bVar3) {
              SPxLPBase<boost::multiprecision::number<boost::multiprecision::backends::cpp_dec_float<100U,_int,_void>,_(boost::multiprecision::expression_template_option)0>_>
              ::number((SPxLPBase<boost::multiprecision::number<boost::multiprecision::backends::cpp_dec_float<100U,_int,_void>,_(boost::multiprecision::expression_template_option)0>_>
                        *)CONCAT17(in_stack_fffffffffffff4f7,
                                   CONCAT16(in_stack_fffffffffffff4f6,
                                            CONCAT24(in_stack_fffffffffffff4f4,
                                                     in_stack_fffffffffffff4f0))),
                       (SPxId *)in_stack_fffffffffffff4e8);
              local_1cc = SPxBasisBase<boost::multiprecision::number<boost::multiprecision::backends::cpp_dec_float<100U,_int,_void>,_(boost::multiprecision::expression_template_option)0>_>
                          ::Desc::colStatus((Desc *)CONCAT17(in_stack_fffffffffffff4e7,
                                                             CONCAT16(in_stack_fffffffffffff4e6,
                                                                      in_stack_fffffffffffff4e0)),
                                            in_stack_fffffffffffff4dc);
              goto LAB_00513c09;
            }
          }
          local_6dc = local_6dc + 1;
        }
        while (stat_00 = (SPxStatus)((ulong)in_stack_fffffffffffff4e8 >> 0x20),
              ((local_1a9 ^ 0xff) & 1) != 0) {
          local_1b0 = 0;
          local_7dc = IdxSet::size(&local_6d8);
          uVar17 = extraout_RDX_05;
          while( true ) {
            local_7dc = local_7dc - 1;
            local_ade = 0;
            if (-1 < (int)local_7dc) {
              local_ade = local_1a9 ^ 0xff;
            }
            if ((local_ade & 1) == 0) break;
            IdxSet::index(&local_6d8,(char *)(ulong)local_7dc,(int)uVar17);
            pSVar16 = SPxBasisBase<boost::multiprecision::number<boost::multiprecision::backends::cpp_dec_float<100U,_int,_void>,_(boost::multiprecision::expression_template_option)0>_>
                      ::baseId((SPxBasisBase<boost::multiprecision::number<boost::multiprecision::backends::cpp_dec_float<100U,_int,_void>,_(boost::multiprecision::expression_template_option)0>_>
                                *)CONCAT17(in_stack_fffffffffffff4e7,
                                           CONCAT16(in_stack_fffffffffffff4e6,
                                                    in_stack_fffffffffffff4e0)),
                               in_stack_fffffffffffff4dc);
            SPxOut::
            debug<soplex::SPxSolverBase<boost::multiprecision::number<boost::multiprecision::backends::cpp_dec_float<100U,_int,_void>,_(boost::multiprecision::expression_template_option)0>_>,_const_char_(&)[17],_soplex::SPxId_&,_0>
                      (in_RDI,(char (*) [17])"try pivoting: {}",pSVar16);
            IdxSet::index(&local_6d8,(char *)(ulong)local_7dc,__c_02);
            local_1d9 = leave(in_stack_00000a68,in_stack_00000a64,(bool)in_stack_00000a63);
            (*(in_RDI->
              super_SPxLPBase<boost::multiprecision::number<boost::multiprecision::backends::cpp_dec_float<100U,_int,_void>,_(boost::multiprecision::expression_template_option)0>_>
              ).
              super_LPRowSetBase<boost::multiprecision::number<boost::multiprecision::backends::cpp_dec_float<100U,_int,_void>,_(boost::multiprecision::expression_template_option)0>_>
              .
              super_SVSetBase<boost::multiprecision::number<boost::multiprecision::backends::cpp_dec_float<100U,_int,_void>,_(boost::multiprecision::expression_template_option)0>_>
              .
              super_ClassArray<soplex::Nonzero<boost::multiprecision::number<boost::multiprecision::backends::cpp_dec_float<100U,_int,_void>,_(boost::multiprecision::expression_template_option)0>_>_>
              ._vptr_ClassArray[0x88])();
            if ((local_1d9 & 1) != 0) {
              SPxOut::
              debug<soplex::SPxSolverBase<boost::multiprecision::number<boost::multiprecision::backends::cpp_dec_float<100U,_int,_void>,_(boost::multiprecision::expression_template_option)0>_>,_const_char_(&)[13],_0>
                        (in_RDI,(char (*) [13])" -> success!");
              local_1b0 = local_1b0 + 1;
              IdxSet::remove(&local_6d8,(char *)(ulong)local_7dc);
              if ((-1 < in_RDI->maxIters) &&
                 (iVar11 = iterations((SPxSolverBase<boost::multiprecision::number<boost::multiprecision::backends::cpp_dec_float<100U,_int,_void>,_(boost::multiprecision::expression_template_option)0>_>
                                       *)0x513ea6), in_RDI->maxIters <= iVar11)) {
                local_1a9 = 1;
              }
            }
            SPxOut::
            debug<soplex::SPxSolverBase<boost::multiprecision::number<boost::multiprecision::backends::cpp_dec_float<100U,_int,_void>,_(boost::multiprecision::expression_template_option)0>_>,_const_char_(&)[2],_0>
                      (in_RDI,(char (*) [2])0x7e7535);
            bVar3 = isTimeLimitReached((SPxSolverBase<boost::multiprecision::number<boost::multiprecision::backends::cpp_dec_float<100U,_int,_void>,_(boost::multiprecision::expression_template_option)0>_>
                                        *)CONCAT44(iVar10,iVar5),
                                       SUB41((uint)in_stack_fffffffffffff554 >> 0x18,0));
            uVar17 = extraout_RDX_06;
            if (bVar3) {
              local_1a9 = 1;
            }
          }
          if (local_1b0 == 0) {
            local_1a9 = 1;
          }
          in_RDI->polishCount = local_1b0 + in_RDI->polishCount;
        }
        DIdxSet::~DIdxSet((DIdxSet *)
                          CONCAT17(in_stack_fffffffffffff4e7,
                                   CONCAT16(in_stack_fffffffffffff4e6,in_stack_fffffffffffff4e0)));
      }
      else {
        dim((SPxSolverBase<boost::multiprecision::number<boost::multiprecision::backends::cpp_dec_float<100U,_int,_void>,_(boost::multiprecision::expression_template_option)0>_>
             *)0x513f66);
        DIdxSet::DIdxSet(in_stack_fffffffffffff500,in_stack_fffffffffffff4fc);
        for (local_804 = 0; iVar5 = local_804,
            iVar10 = dim((SPxSolverBase<boost::multiprecision::number<boost::multiprecision::backends::cpp_dec_float<100U,_int,_void>,_(boost::multiprecision::expression_template_option)0>_>
                          *)0x513f98), iVar5 < iVar10; local_804 = local_804 + 1) {
          pDVar15 = &SPxBasisBase<boost::multiprecision::number<boost::multiprecision::backends::cpp_dec_float<100U,_int,_void>,_(boost::multiprecision::expression_template_option)0>_>
                     ::baseId((SPxBasisBase<boost::multiprecision::number<boost::multiprecision::backends::cpp_dec_float<100U,_int,_void>,_(boost::multiprecision::expression_template_option)0>_>
                               *)CONCAT17(in_stack_fffffffffffff4e7,
                                          CONCAT16(in_stack_fffffffffffff4e6,
                                                   in_stack_fffffffffffff4e0)),
                              in_stack_fffffffffffff4dc)->super_DataKey;
          local_1d8 = *pDVar15;
          bVar3 = SPxId::isSPxRowId((SPxId *)&local_1d8);
          if (!bVar3) {
            bVar3 = false;
            if ((local_6ad & 1) != 0) {
              this_00 = &in_RDI->integerVariables;
              SPxColId::SPxColId(&local_80c,(SPxId *)&local_1d8);
              iVar5 = SPxLPBase<boost::multiprecision::number<boost::multiprecision::backends::cpp_dec_float<100U,_int,_void>,_(boost::multiprecision::expression_template_option)0>_>
                      ::number((SPxLPBase<boost::multiprecision::number<boost::multiprecision::backends::cpp_dec_float<100U,_int,_void>,_(boost::multiprecision::expression_template_option)0>_>
                                *)CONCAT17(in_stack_fffffffffffff4e7,
                                           CONCAT16(in_stack_fffffffffffff4e6,
                                                    in_stack_fffffffffffff4e0)),
                               (SPxColId *)
                               CONCAT44(in_stack_fffffffffffff4dc,in_stack_fffffffffffff4d8));
              piVar13 = DataArray<int>::operator[](this_00,iVar5);
              bVar3 = *piVar13 == 0;
            }
            if ((!bVar3) &&
               ((local_1cc = SPxBasisBase<boost::multiprecision::number<boost::multiprecision::backends::cpp_dec_float<100U,_int,_void>,_(boost::multiprecision::expression_template_option)0>_>
                             ::Desc::colStatus((Desc *)CONCAT17(in_stack_fffffffffffff4e7,
                                                                CONCAT16(in_stack_fffffffffffff4e6,
                                                                         in_stack_fffffffffffff4e0))
                                               ,in_stack_fffffffffffff4dc), local_1cc == P_ON_LOWER
                || (local_1cc == P_ON_UPPER)))) {
              local_f8 = VectorBase<boost::multiprecision::number<boost::multiprecision::backends::cpp_dec_float<100U,_int,_void>,_(boost::multiprecision::expression_template_option)0>_>
                         ::operator[]((VectorBase<boost::multiprecision::number<boost::multiprecision::backends::cpp_dec_float<100U,_int,_void>,_(boost::multiprecision::expression_template_option)0>_>
                                       *)CONCAT17(in_stack_fffffffffffff4e7,
                                                  CONCAT16(in_stack_fffffffffffff4e6,
                                                           in_stack_fffffffffffff4e0)),
                                      in_stack_fffffffffffff4dc);
              local_f0 = local_85c;
              boost::multiprecision::backends::cpp_dec_float<100U,_int,_void>::cpp_dec_float
                        ((cpp_dec_float<100U,_int,_void> *)
                         CONCAT17(in_stack_fffffffffffff4e7,
                                  CONCAT16(in_stack_fffffffffffff4e6,in_stack_fffffffffffff4e0)),
                         (cpp_dec_float<100U,_int,_void> *)
                         CONCAT44(in_stack_fffffffffffff4dc,in_stack_fffffffffffff4d8));
              local_8b0 = 0;
              local_128 = local_8ac;
              local_130 = &local_8b0;
              local_138 = 0;
              local_a8 = local_130;
              boost::multiprecision::backends::cpp_dec_float<100U,_int,_void>::
              cpp_dec_float<long_long>
                        ((cpp_dec_float<100U,_int,_void> *)
                         CONCAT17(in_stack_fffffffffffff4f7,
                                  CONCAT16(in_stack_fffffffffffff4f6,
                                           CONCAT24(in_stack_fffffffffffff4f4,
                                                    in_stack_fffffffffffff4f0))),
                         (longlong)in_stack_fffffffffffff4e8,
                         (type *)CONCAT17(in_stack_fffffffffffff4e7,
                                          CONCAT16(in_stack_fffffffffffff4e6,
                                                   in_stack_fffffffffffff4e0)));
              epsilon(in_stack_fffffffffffff4e8);
              in_stack_fffffffffffff4f7 =
                   EQrel<boost::multiprecision::number<boost::multiprecision::backends::cpp_dec_float<100u,int,void>,(boost::multiprecision::expression_template_option)0>,boost::multiprecision::number<boost::multiprecision::backends::cpp_dec_float<100u,int,void>,(boost::multiprecision::expression_template_option)0>,boost::multiprecision::number<boost::multiprecision::backends::cpp_dec_float<100u,int,void>,(boost::multiprecision::expression_template_option)0>>
                             (in_stack_fffffffffffff630,in_stack_fffffffffffff628,
                              in_stack_fffffffffffff620);
              if ((bool)in_stack_fffffffffffff4f7) {
                DIdxSet::addIdx((DIdxSet *)
                                CONCAT17(in_stack_fffffffffffff4e7,
                                         CONCAT16(in_stack_fffffffffffff4e6,
                                                  in_stack_fffffffffffff4e0)),
                                in_stack_fffffffffffff4dc);
              }
            }
          }
        }
        while (stat_00 = (SPxStatus)((ulong)in_stack_fffffffffffff4e8 >> 0x20),
              ((local_1a9 ^ 0xff) & 1) != 0) {
          local_1b0 = 0;
          local_904 = IdxSet::size(&local_800);
          uVar17 = extraout_RDX_07;
          while( true ) {
            local_904 = local_904 - 1;
            in_stack_fffffffffffff4f6 = 0;
            if (-1 < (int)local_904) {
              in_stack_fffffffffffff4f6 = local_1a9 ^ 0xff;
            }
            if ((in_stack_fffffffffffff4f6 & 1) == 0) break;
            in_stack_fffffffffffff4e8 =
                 (SPxSolverBase<boost::multiprecision::number<boost::multiprecision::backends::cpp_dec_float<100U,_int,_void>,_(boost::multiprecision::expression_template_option)0>_>
                  *)&in_RDI->
                     super_SPxBasisBase<boost::multiprecision::number<boost::multiprecision::backends::cpp_dec_float<100U,_int,_void>,_(boost::multiprecision::expression_template_option)0>_>
            ;
            IdxSet::index(&local_800,(char *)(ulong)local_904,(int)uVar17);
            pSVar16 = SPxBasisBase<boost::multiprecision::number<boost::multiprecision::backends::cpp_dec_float<100U,_int,_void>,_(boost::multiprecision::expression_template_option)0>_>
                      ::baseId((SPxBasisBase<boost::multiprecision::number<boost::multiprecision::backends::cpp_dec_float<100U,_int,_void>,_(boost::multiprecision::expression_template_option)0>_>
                                *)CONCAT17(in_stack_fffffffffffff4e7,
                                           CONCAT16(in_stack_fffffffffffff4e6,
                                                    in_stack_fffffffffffff4e0)),
                               in_stack_fffffffffffff4dc);
            SPxOut::
            debug<soplex::SPxSolverBase<boost::multiprecision::number<boost::multiprecision::backends::cpp_dec_float<100U,_int,_void>,_(boost::multiprecision::expression_template_option)0>_>,_const_char_(&)[17],_soplex::SPxId_&,_0>
                      (in_RDI,(char (*) [17])"try pivoting: {}",pSVar16);
            IdxSet::index(&local_800,(char *)(ulong)local_904,__c_03);
            in_stack_fffffffffffff4e7 =
                 leave(in_stack_00000a68,in_stack_00000a64,(bool)in_stack_00000a63);
            local_1d9 = in_stack_fffffffffffff4e7;
            (*(in_RDI->
              super_SPxLPBase<boost::multiprecision::number<boost::multiprecision::backends::cpp_dec_float<100U,_int,_void>,_(boost::multiprecision::expression_template_option)0>_>
              ).
              super_LPRowSetBase<boost::multiprecision::number<boost::multiprecision::backends::cpp_dec_float<100U,_int,_void>,_(boost::multiprecision::expression_template_option)0>_>
              .
              super_SVSetBase<boost::multiprecision::number<boost::multiprecision::backends::cpp_dec_float<100U,_int,_void>,_(boost::multiprecision::expression_template_option)0>_>
              .
              super_ClassArray<soplex::Nonzero<boost::multiprecision::number<boost::multiprecision::backends::cpp_dec_float<100U,_int,_void>,_(boost::multiprecision::expression_template_option)0>_>_>
              ._vptr_ClassArray[0x88])();
            if ((local_1d9 & 1) != 0) {
              SPxOut::
              debug<soplex::SPxSolverBase<boost::multiprecision::number<boost::multiprecision::backends::cpp_dec_float<100U,_int,_void>,_(boost::multiprecision::expression_template_option)0>_>,_const_char_(&)[13],_0>
                        (in_RDI,(char (*) [13])" -> success!");
              local_1b0 = local_1b0 + 1;
              IdxSet::remove(&local_800,(char *)(ulong)local_904);
              if ((-1 < in_RDI->maxIters) &&
                 (iVar5 = iterations((SPxSolverBase<boost::multiprecision::number<boost::multiprecision::backends::cpp_dec_float<100U,_int,_void>,_(boost::multiprecision::expression_template_option)0>_>
                                      *)0x514350), in_RDI->maxIters <= iVar5)) {
                local_1a9 = 1;
              }
            }
            SPxOut::
            debug<soplex::SPxSolverBase<boost::multiprecision::number<boost::multiprecision::backends::cpp_dec_float<100U,_int,_void>,_(boost::multiprecision::expression_template_option)0>_>,_const_char_(&)[2],_0>
                      (in_RDI,(char (*) [2])0x7e7535);
            in_stack_fffffffffffff4e6 =
                 isTimeLimitReached((SPxSolverBase<boost::multiprecision::number<boost::multiprecision::backends::cpp_dec_float<100U,_int,_void>,_(boost::multiprecision::expression_template_option)0>_>
                                     *)CONCAT44(in_stack_fffffffffffff55c,in_stack_fffffffffffff558)
                                    ,SUB41((uint)in_stack_fffffffffffff554 >> 0x18,0));
            uVar17 = extraout_RDX_08;
            if ((bool)in_stack_fffffffffffff4e6) {
              local_1a9 = 1;
            }
          }
          if (local_1b0 == 0) {
            local_1a9 = 1;
          }
          in_RDI->polishCount = local_1b0 + in_RDI->polishCount;
        }
        DIdxSet::~DIdxSet((DIdxSet *)
                          CONCAT17(in_stack_fffffffffffff4e7,
                                   CONCAT16(in_stack_fffffffffffff4e6,in_stack_fffffffffffff4e0)));
      }
    }
    if ((in_RDI->spxout != (SPxOut *)0x0) &&
       (VVar7 = SPxOut::getVerbosity(in_RDI->spxout), 2 < (int)VVar7)) {
      local_908 = SPxOut::getVerbosity(in_RDI->spxout);
      local_90c = 3;
      (*in_RDI->spxout->_vptr_SPxOut[2])(in_RDI->spxout,&local_90c);
      soplex::operator<<((SPxOut *)
                         CONCAT17(in_stack_fffffffffffff4e7,
                                  CONCAT16(in_stack_fffffffffffff4e6,in_stack_fffffffffffff4e0)),
                         (char *)CONCAT44(in_stack_fffffffffffff4dc,in_stack_fffffffffffff4d8));
      soplex::operator<<((SPxOut *)
                         CONCAT17(in_stack_fffffffffffff4e7,
                                  CONCAT16(in_stack_fffffffffffff4e6,in_stack_fffffffffffff4e0)),
                         in_stack_fffffffffffff4dc);
      soplex::operator<<((SPxOut *)
                         CONCAT17(in_stack_fffffffffffff4e7,
                                  CONCAT16(in_stack_fffffffffffff4e6,in_stack_fffffffffffff4e0)),
                         (char *)CONCAT44(in_stack_fffffffffffff4dc,in_stack_fffffffffffff4d8));
      soplex::operator<<((SPxOut *)
                         CONCAT17(in_stack_fffffffffffff4e7,
                                  CONCAT16(in_stack_fffffffffffff4e6,in_stack_fffffffffffff4e0)),
                         (_func_ostream_ptr_ostream_ptr *)
                         CONCAT44(in_stack_fffffffffffff4dc,in_stack_fffffffffffff4d8));
      (*in_RDI->spxout->_vptr_SPxOut[2])(in_RDI->spxout,&local_908);
    }
    SPxBasisBase<boost::multiprecision::number<boost::multiprecision::backends::cpp_dec_float<100U,_int,_void>,_(boost::multiprecision::expression_template_option)0>_>
    ::setStatus((SPxBasisBase<boost::multiprecision::number<boost::multiprecision::backends::cpp_dec_float<100U,_int,_void>,_(boost::multiprecision::expression_template_option)0>_>
                 *)CONCAT17(in_stack_fffffffffffff4f7,
                            CONCAT16(in_stack_fffffffffffff4f6,
                                     CONCAT24(in_stack_fffffffffffff4f4,in_stack_fffffffffffff4f0)))
                ,stat_00);
    (*(in_RDI->
      super_SPxLPBase<boost::multiprecision::number<boost::multiprecision::backends::cpp_dec_float<100U,_int,_void>,_(boost::multiprecision::expression_template_option)0>_>
      ).
      super_LPRowSetBase<boost::multiprecision::number<boost::multiprecision::backends::cpp_dec_float<100U,_int,_void>,_(boost::multiprecision::expression_template_option)0>_>
      .
      super_SVSetBase<boost::multiprecision::number<boost::multiprecision::backends::cpp_dec_float<100U,_int,_void>,_(boost::multiprecision::expression_template_option)0>_>
      .
      super_ClassArray<soplex::Nonzero<boost::multiprecision::number<boost::multiprecision::backends::cpp_dec_float<100U,_int,_void>,_(boost::multiprecision::expression_template_option)0>_>_>
      ._vptr_ClassArray[0x5e])(local_95c);
    local_e0 = local_9ac;
    local_e8 = local_27c;
    boost::multiprecision::backends::cpp_dec_float<100U,_int,_void>::cpp_dec_float
              ((cpp_dec_float<100U,_int,_void> *)
               CONCAT17(in_stack_fffffffffffff4e7,
                        CONCAT16(in_stack_fffffffffffff4e6,in_stack_fffffffffffff4e0)),
               (cpp_dec_float<100U,_int,_void> *)
               CONCAT44(in_stack_fffffffffffff4dc,in_stack_fffffffffffff4d8));
    local_d0 = local_9fc;
    local_d8 = local_22c;
    boost::multiprecision::backends::cpp_dec_float<100U,_int,_void>::cpp_dec_float
              ((cpp_dec_float<100U,_int,_void> *)
               CONCAT17(in_stack_fffffffffffff4e7,
                        CONCAT16(in_stack_fffffffffffff4e6,in_stack_fffffffffffff4e0)),
               (cpp_dec_float<100U,_int,_void> *)
               CONCAT44(in_stack_fffffffffffff4dc,in_stack_fffffffffffff4d8));
    bVar3 = EQrel<boost::multiprecision::number<boost::multiprecision::backends::cpp_dec_float<100u,int,void>,(boost::multiprecision::expression_template_option)0>,boost::multiprecision::number<boost::multiprecision::backends::cpp_dec_float<100u,int,void>,(boost::multiprecision::expression_template_option)0>,boost::multiprecision::number<boost::multiprecision::backends::cpp_dec_float<100u,int,void>,(boost::multiprecision::expression_template_option)0>>
                      (in_stack_fffffffffffff630,in_stack_fffffffffffff628,in_stack_fffffffffffff620
                      );
    if (((bVar3 ^ 0xffU) & 1) == 0) {
      local_199 = false;
    }
    else {
      local_199 = true;
    }
  }
  else {
    local_199 = false;
  }
  return local_199;
}

Assistant:

bool SPxSolverBase<R>::performSolutionPolishing()
{
   // catch rare case that the iteration limit is exactly reached at optimality
   bool stop = (maxIters >= 0 && iterations() >= maxIters && !isTimeLimitReached());

   // only polish an already optimal basis
   if(stop || polishObj == POLISH_OFF || status() != OPTIMAL)
      return false;

   int nSuccessfulPivots;
   const typename SPxBasisBase<R>::Desc& ds = this->desc();
   const typename SPxBasisBase<R>::Desc::Status* rowstatus = ds.rowStatus();
   const typename SPxBasisBase<R>::Desc::Status* colstatus = ds.colStatus();
   typename SPxBasisBase<R>::Desc::Status stat;
   SPxId polishId;
   bool success = false;

   R alloweddeviation;
   R origval = value();

   SPX_MSG_INFO2((*this->spxout), (*this->spxout) << " --- perform solution polishing" << std::endl;)

   if(rep() == COLUMN)
   {
      setType(ENTER); // use primal simplex to preserve feasibility
      init();
      alloweddeviation = entertol();

      instableEnter = false;
      theratiotester->setType(type());

      int nrows = this->nRows();
      int ncols = this->nCols();

      assert(nrows >= 0);
      assert(ncols >= 0);

      if(polishObj == POLISH_INTEGRALITY)
      {
         DIdxSet slackcandidates(nrows);
         DIdxSet continuousvars(ncols);

         // collect nonbasic slack variables that could be made basic
         for(int i = 0; i < nrows; ++i)
         {
            // only check nonbasic rows, skip equations
            if(rowstatus[i] ==  SPxBasisBase<R>::Desc::P_ON_LOWER
                  || rowstatus[i] == SPxBasisBase<R>::Desc::P_ON_UPPER)
            {
               // only consider rows with zero dual multiplier to preserve optimality
               if(EQrel((*theCoPvec)[i], (R) 0, this->epsilon()))
                  slackcandidates.addIdx(i);
            }
         }

         // collect continuous variables that could be made basic
         if(integerVariables.size() == ncols)
         {
            for(int i = 0; i < ncols; ++i)
            {
               // skip fixed variables
               if(colstatus[i] == SPxBasisBase<R>::Desc::P_ON_LOWER
                     || colstatus[i] ==  SPxBasisBase<R>::Desc::P_ON_UPPER)
               {
                  // only consider continuous variables with zero dual multiplier to preserve optimality
                  if(EQrel(this->maxObj(i) - (*thePvec)[i], (R) 0, this->epsilon()) && integerVariables[i] == 0)
                     continuousvars.addIdx(i);
               }
            }
         }

         while(!stop)
         {
            nSuccessfulPivots = 0;

            // identify nonbasic slack variables, i.e. rows, that may be moved into the basis
            for(int i = slackcandidates.size() - 1; i >= 0 && !stop; --i)
            {
               // coverity[forward_null]
               polishId = coId(slackcandidates.index(i));
               SPxOut::debug(this, "try pivoting: {} stat: {}\n", polishId, rowstatus[slackcandidates.index(i)]);
               success = enter(polishId, true);
               clearUpdateVecs();

               if(success)
               {
                  SPxOut::debug(this, " -> success!");
                  ++nSuccessfulPivots;
                  slackcandidates.remove(i);

                  if(maxIters >= 0 && iterations() >= maxIters)
                     stop = true;
               }

               SPxOut::debug(this, "\n");

               if(isTimeLimitReached())
                  stop = true;
            }

            // identify nonbasic variables that may be moved into the basis
            for(int i = continuousvars.size() - 1; i >= 0 && !stop; --i)
            {
               polishId = id(continuousvars.index(i));
               SPxOut::debug(this, "try pivoting: {} stat: {}\n", polishId, colstatus[continuousvars.index(i)]);
               success = enter(polishId, true);
               clearUpdateVecs();

               if(success)
               {
                  SPxOut::debug(this, " -> success!");
                  ++nSuccessfulPivots;
                  continuousvars.remove(i);

                  if(maxIters >= 0 && iterations() >= maxIters)
                     stop = true;
               }

               SPxOut::debug(this, "\n");

               if(isTimeLimitReached())
                  stop = true;
            }

            // terminate if in the last round no more polishing steps were performed
            if(nSuccessfulPivots == 0)
               stop = true;

            polishCount += nSuccessfulPivots;
         }
      }
      else
      {
         assert(polishObj == POLISH_FRACTIONALITY);
         assert(dim() >= 0);
         DIdxSet candidates(dim());

         // identify nonbasic variables, i.e. columns, that may be moved into the basis
         for(int i = 0; i < this->nCols() && !stop; ++i)
         {
            if(colstatus[i] == SPxBasisBase<R>::Desc::P_ON_LOWER
                  || colstatus[i] == SPxBasisBase<R>::Desc::P_ON_UPPER)
            {
               // only consider variables with zero reduced costs to preserve optimality
               if(EQrel(this->maxObj(i) - (*thePvec)[i], (R) 0, this->epsilon()))
                  candidates.addIdx(i);
            }
         }

         while(!stop)
         {
            nSuccessfulPivots = 0;

            for(int i = candidates.size() - 1; i >= 0 && !stop; --i)
            {
               // coverity[forward_null]
               polishId = id(candidates.index(i));
               SPxOut::debug(this, "try pivoting: {} stat: {}\n", polishId, colstatus[candidates.index(i)]);
               success = enter(polishId, true);
               clearUpdateVecs();

               if(success)
               {
                  SPxOut::debug(this, " -> success!");
                  ++nSuccessfulPivots;
                  candidates.remove(i);

                  if(maxIters >= 0 && iterations() >= maxIters)
                     stop = true;
               }

               SPxOut::debug(this, "\n");

               if(isTimeLimitReached())
                  stop = true;
            }

            // terminate if in the last round no more polishing steps were performed
            if(nSuccessfulPivots == 0)
               stop = true;

            polishCount += nSuccessfulPivots;
         }
      }
   }
   else
   {
      setType(LEAVE); // use primal simplex to preserve feasibility
      init();
      alloweddeviation = leavetol();
      instableLeave = false;
      theratiotester->setType(type());
      bool useIntegrality = false;
      int ncols = this->nCols();

      if(integerVariables.size() == ncols)
         useIntegrality = true;

      // in ROW rep: pivot slack out of the basis
      if(polishObj == POLISH_INTEGRALITY)
      {
         assert(dim() >= 0);
         DIdxSet basiccandidates(dim());

         // collect basic candidates that may be moved out of the basis
         for(int i = 0; i < dim(); ++i)
         {
            polishId = this->baseId(i);

            if(polishId.isSPxRowId())
               stat = ds.rowStatus(this->number(polishId));
            else
            {
               // skip (integer) variables
               if(!useIntegrality || integerVariables[this->number(SPxColId(polishId))] == 1)
                  continue;

               stat = ds.colStatus(this->number(polishId));
            }

            if(stat == SPxBasisBase<R>::Desc::P_ON_LOWER || stat ==  SPxBasisBase<R>::Desc::P_ON_UPPER)
            {
               if(EQrel((*theFvec)[i], (R) 0, this->epsilon()))
                  basiccandidates.addIdx(i);
            }
         }

         while(!stop)
         {
            nSuccessfulPivots = 0;

            for(int i = basiccandidates.size() - 1; i >= 0 && !stop; --i)
            {
               // coverity[forward_null]
               SPxOut::debug(this, "try pivoting: {}", this->baseId(basiccandidates.index(i)));
               success = leave(basiccandidates.index(i), true);
               clearUpdateVecs();

               if(success)
               {
                  SPxOut::debug(this, " -> success!");
                  ++nSuccessfulPivots;
                  basiccandidates.remove(i);

                  if(maxIters >= 0 && iterations() >= maxIters)
                     stop = true;
               }

               SPxOut::debug(this, "\n");

               if(isTimeLimitReached())
                  stop = true;
            }

            // terminate if in the last round no more polishing steps were performed
            if(nSuccessfulPivots == 0)
               stop = true;

            polishCount += nSuccessfulPivots;
         }
      }
      else
      {
         assert(polishObj == POLISH_FRACTIONALITY);
         assert(dim() >= 0);
         DIdxSet basiccandidates(dim());

         // collect basic (integer) variables, that may be moved out of the basis
         for(int i = 0; i < dim(); ++i)
         {
            polishId = this->baseId(i);

            if(polishId.isSPxRowId())
               continue;
            else
            {
               if(useIntegrality && integerVariables[this->number(SPxColId(polishId))] == 0)
                  continue;

               stat = ds.colStatus(i);
            }

            if(stat == SPxBasisBase<R>::Desc::P_ON_LOWER || stat ==  SPxBasisBase<R>::Desc::P_ON_UPPER)
            {
               if(EQrel((*theFvec)[i], (R) 0, this->epsilon()))
                  basiccandidates.addIdx(i);
            }
         }

         while(!stop)
         {
            nSuccessfulPivots = 0;

            for(int i = basiccandidates.size() - 1; i >= 0 && !stop; --i)
            {
               // coverity[forward_null]
               SPxOut::debug(this, "try pivoting: {}", this->baseId(basiccandidates.index(i)));
               success = leave(basiccandidates.index(i), true);
               clearUpdateVecs();

               if(success)
               {
                  SPxOut::debug(this, " -> success!");
                  ++nSuccessfulPivots;
                  basiccandidates.remove(i);

                  if(maxIters >= 0 && iterations() >= maxIters)
                     stop = true;
               }

               SPxOut::debug(this, "\n");

               if(isTimeLimitReached())
                  stop = true;
            }

            // terminate if in the last round no more polishing steps were performed
            if(nSuccessfulPivots == 0)
               stop = true;

            polishCount += nSuccessfulPivots;
         }
      }
   }

   SPX_MSG_INFO1((*this->spxout),
                 (*this->spxout) << " --- finished solution polishing (" << polishCount << " pivots)" << std::endl;)

   this->setStatus(SPxBasisBase<R>::OPTIMAL);

   // if the value() changed significantly (due to numerics) reoptimize after polishing
   if(!EQrel(value(), origval, alloweddeviation))
      return true;
   else
      return false;
}